

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O3

Vec<Hpipe::BranchSet::Range> * __thiscall
Hpipe::Vec<Hpipe::BranchSet::Range>::from
          (Vec<Hpipe::BranchSet::Range> *__return_storage_ptr__,Vec<Hpipe::BranchSet::Range> *this,
          uint beg)

{
  iterator __position;
  Instruction *pIVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer pRVar5;
  uint uVar6;
  ulong uVar7;
  Range *__args;
  
  (__return_storage_ptr__->
  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = (ulong)beg;
  std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::reserve
            (&__return_storage_ptr__->
              super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>,
             ((long)(this->
                    super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
                    .
                    super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->
                    super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
                    .
                    super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) - uVar7);
  pRVar5 = (this->super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
           super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar7 < (ulong)((long)(this->
                            super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                            ).
                            super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5 >> 5)) {
    uVar6 = beg + 1;
    do {
      __args = pRVar5 + uVar7;
      __position._M_current =
           (__return_storage_ptr__->
           super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
           super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
          super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>>::
        _M_realloc_insert<Hpipe::BranchSet::Range_const&>
                  ((vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>> *)
                   __return_storage_ptr__,__position,__args);
      }
      else {
        iVar3 = __args->beg;
        iVar4 = __args->end;
        pIVar1 = __args->inst;
        dVar2 = __args->freq;
        (__position._M_current)->name = __args->name;
        (__position._M_current)->freq = dVar2;
        (__position._M_current)->beg = iVar3;
        (__position._M_current)->end = iVar4;
        (__position._M_current)->inst = pIVar1;
        (__return_storage_ptr__->
        super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar7 = (ulong)uVar6;
      pRVar5 = (this->
               super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
               super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
    } while (uVar7 < (ulong)((long)(this->
                                   super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                                   ).
                                   super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5 >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

Vec      from                 ( unsigned beg               ) const { Vec res; res.reserve( this->size() - beg ); for( unsigned i = beg; i < this->size(); ++i ) res << this->operator[]( i ); return res; }